

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

RecyclableObject * __thiscall Js::JavascriptProxy::GetPrototypeSpecial(JavascriptProxy *this)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  int iVar7;
  HostScriptContext *pHVar8;
  Var pvVar9;
  RecyclableObject *pRVar10;
  JavascriptFunction *function;
  RecyclableObject *ptr;
  JavascriptMethod p_Var11;
  undefined4 *puVar12;
  RecyclableObject *this_01;
  Type typeId;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return (RecyclableObject *)0x0;
  }
  pHVar8 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar8->scriptContext;
  pvVar9 = CrossSite::MarshalVar(pSVar2,(this->handler).ptr,false);
  if (pvVar9 == (Var)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return (RecyclableObject *)0x0;
    }
    JavascriptError::ThrowTypeError
              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"getPrototypeOf");
  }
  pRVar10 = (RecyclableObject *)CrossSite::MarshalVar(pSVar2,(this->target).ptr,false);
  function = GetMethodHelper(this,0x199,pSVar2);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar4 = Memory::Recycler::IsHeapEnumInProgress
                        (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                            javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)
                         ->recycler), bVar4)) {
    ptr = (RecyclableObject *)JavascriptObject::GetPrototypeOf(pRVar10,pSVar2);
    goto LAB_00d0c1bf;
  }
  bVar4 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar5) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var11)((RecyclableObject *)function,(CallInfo)function,0x2000002,0,0,0,0,0x2000002,
                     pvVar9,pRVar10);
    bVar5 = ThreadContext::IsOnStack(ptr);
LAB_00d0bed8:
    if (bVar5 != false) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
      if (this_00->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var11);
      p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var11)((RecyclableObject *)function,(CallInfo)function,0x2000002,0,0,0,0,0x2000002,
                       pvVar9,pRVar10);
      bVar5 = ThreadContext::IsOnStack(ptr);
      goto LAB_00d0bed8;
    }
    IVar1 = this_00->implicitCallFlags;
    ThreadContext::CheckAndResetReentrancySafeOrHandled(this_00);
    if (this_00->noJsReentrancy == true) {
      Throw::FatalJsReentrancyError();
    }
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var11);
    p_Var11 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var11)((RecyclableObject *)function,(CallInfo)function,0x2000002,0,0,0,0,0x2000002,
                     pvVar9,pRVar10);
    this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  this_00->reentrancySafeOrHandled = bVar4;
  if (ptr == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar4) goto LAB_00d0c25d;
    *puVar12 = 0;
  }
  if (((ulong)ptr & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)ptr & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar4) goto LAB_00d0c25d;
    *puVar12 = 0;
  }
  typeId = TypeIds_FirstNumberType;
  if ((((ulong)ptr & 0xffff000000000000) != 0x1000000000000) &&
     (typeId = TypeIds_Number, (ulong)ptr >> 0x32 == 0)) {
    this_01 = UnsafeVarTo<Js::RecyclableObject>(ptr);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00d0c25d;
      *puVar12 = 0;
    }
    typeId = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar6 = RecyclableObject::IsExternal(this_01), BVar6 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar4) {
LAB_00d0c25d:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar12 = 0;
    }
  }
  BVar6 = JavascriptOperators::IsObjectType(typeId);
  if ((typeId != TypeIds_Null) && (BVar6 == 0)) {
LAB_00d0c266:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"getPrototypeOf");
  }
  iVar7 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x33])(pRVar10);
  if (iVar7 == 0) {
    pRVar10 = RecyclableObject::GetPrototype(pRVar10);
    bVar4 = JavascriptConversion::SameValueCommon<false>(ptr,pRVar10);
    if (!bVar4) goto LAB_00d0c266;
  }
LAB_00d0c1bf:
  pRVar10 = VarTo<Js::RecyclableObject>(ptr);
  return pRVar10;
}

Assistant:

RecyclableObject* JavascriptProxy::GetPrototypeSpecial()
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return nullptr;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return nullptr;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("getPrototypeOf"));
        }

        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        JavascriptFunction* getPrototypeOfMethod = GetMethodHelper(PropertyIds::getPrototypeOf, requestContext);

        if (nullptr == getPrototypeOfMethod || GetScriptContext()->IsHeapEnumInProgress())
        {
            return VarTo<RecyclableObject>(JavascriptObject::GetPrototypeOf(targetObj, requestContext));
        }

        Var getPrototypeOfResult = threadContext->ExecuteImplicitCall(getPrototypeOfMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, getPrototypeOfMethod, CallInfo(CallFlags_Value, 2), handlerObj, targetObj);
        });

        TypeId prototypeTypeId = JavascriptOperators::GetTypeId(getPrototypeOfResult);
        if (!JavascriptOperators::IsObjectType(prototypeTypeId) && prototypeTypeId != TypeIds_Null)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getPrototypeOf"));
        }
        if (!targetObj->IsExtensible() && !JavascriptConversion::SameValue(getPrototypeOfResult, targetObj->GetPrototype()))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getPrototypeOf"));
        }
        return VarTo<RecyclableObject>(getPrototypeOfResult);
    }